

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::StatsBindData::Copy(StatsBindData *this)

{
  _func_int **pp_Var1;
  long in_RSI;
  _func_int **local_48;
  _func_int *local_40;
  _func_int *local_38;
  _func_int *p_Stack_30;
  
  pp_Var1 = (_func_int **)operator_new(0x28);
  local_48 = &local_38;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,*(long *)(in_RSI + 8),
             *(long *)(in_RSI + 0x10) + *(long *)(in_RSI + 8));
  *pp_Var1 = (_func_int *)&PTR__StatsBindData_024c5448;
  pp_Var1[1] = (_func_int *)(pp_Var1 + 3);
  if (local_48 == &local_38) {
    pp_Var1[3] = local_38;
    pp_Var1[4] = p_Stack_30;
  }
  else {
    pp_Var1[1] = (_func_int *)local_48;
    pp_Var1[3] = local_38;
  }
  pp_Var1[2] = local_40;
  (this->super_FunctionData)._vptr_FunctionData = pp_Var1;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

unique_ptr<FunctionData> Copy() const override {
		return make_uniq<StatsBindData>(stats);
	}